

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_connect_nonblocking(connectdata *conn,int sockindex,_Bool *done)

{
  _Bool _Var1;
  CURLcode result;
  _Bool *done_local;
  int sockindex_local;
  connectdata *conn_local;
  
  if ((((conn->bits).proxy_ssl_connected[sockindex] & 1U) == 0) ||
     (conn_local._4_4_ = ssl_connect_init_proxy(conn,sockindex), conn_local._4_4_ == CURLE_OK)) {
    _Var1 = ssl_prefs_check(conn->data);
    if (_Var1) {
      conn->ssl[sockindex].use = true;
      conn_local._4_4_ = (*Curl_ssl->connect_nonblocking)(conn,sockindex,done);
      if ((conn_local._4_4_ == CURLE_OK) && ((*done & 1U) != 0)) {
        Curl_pgrsTime(conn->data,TIMER_APPCONNECT);
      }
    }
    else {
      conn_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct connectdata *conn, int sockindex,
                             bool *done)
{
  CURLcode result;
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }

  if(!ssl_prefs_check(conn->data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
  result = Curl_ssl->connect_nonblocking(conn, sockindex, done);
  if(!result && *done)
    Curl_pgrsTime(conn->data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}